

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *row,bool scale)

{
  type_conflict5 tVar1;
  int iVar2;
  ulong *puVar3;
  int *piVar4;
  byte in_DL;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  long *in_RDI;
  int k;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  empty;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  int i;
  int j;
  DataArray<int> *colscaleExp;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  int newRowScaleExp;
  int oldColNumber;
  int idx;
  undefined4 in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  int in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffff9f4;
  int in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffff9fc;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffa00;
  int local_5d4;
  int in_stack_fffffffffffffa4c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffa50;
  undefined1 local_4c0 [80];
  undefined1 local_470 [80];
  undefined1 local_420 [80];
  int local_3d0;
  uint local_3cc;
  undefined1 local_3c8 [80];
  undefined1 local_378 [80];
  undefined1 local_328 [80];
  undefined1 local_2d8 [80];
  ulong local_288;
  undefined1 local_280 [80];
  undefined1 local_230 [80];
  undefined1 local_1e0 [80];
  undefined1 local_190 [80];
  DataArray<int> *local_140;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_138;
  int local_130;
  int local_12c;
  int local_128;
  byte local_121;
  undefined8 local_110;
  undefined8 local_108;
  undefined1 *local_100;
  undefined8 local_f8;
  ulong *local_f0;
  undefined1 *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined1 *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  ulong *local_10;
  undefined8 local_8;
  
  local_121 = in_DL & 1;
  local_128 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x4ff224);
  local_12c = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x4ff235);
  local_130 = 0;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)in_stack_fffffffffffffa00,
        (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  local_138 = rowVector_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                          in_stack_fffffffffffff9ec);
  local_140 = (DataArray<int> *)(in_RDI + 0x2f);
  if (((local_121 & 1) != 0) && (in_RDI[0x3d] != 0)) {
    local_130 = (**(code **)(*(long *)in_RDI[0x3d] + 8))((long *)in_RDI[0x3d],local_138,local_140);
    rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),in_stack_fffffffffffff9ec);
    local_108 = infinity();
    local_100 = local_190;
    local_110 = 0;
    local_8 = local_108;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffa00,
               (double)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (type *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x4ff356);
    if (tVar1) {
      local_e0 = rhs_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                       in_stack_fffffffffffff9ec);
      local_d8 = local_230;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c);
      local_58 = rhs_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                       in_stack_fffffffffffff9ec);
      local_60 = local_1e0;
      local_50 = local_60;
      local_18 = local_60;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    }
    in_stack_fffffffffffffa00 =
         (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                in_stack_fffffffffffff9ec);
    puVar3 = (ulong *)infinity();
    local_288 = *puVar3 ^ 0x8000000000000000;
    local_e8 = local_280;
    local_f0 = &local_288;
    local_f8 = 0;
    local_10 = local_f0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffa00,
               (double)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (type *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x4ff4c1);
    if (tVar1) {
      local_d0 = lhs_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                       in_stack_fffffffffffff9ec);
      local_c8 = local_328;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c);
      local_68 = lhs_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                       in_stack_fffffffffffff9ec);
      local_70 = local_2d8;
      local_48 = local_70;
      local_20 = local_70;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    }
    local_c0 = maxRowObj_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                           in_stack_fffffffffffff9ec);
    local_b8 = local_3c8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c);
    local_78 = maxRowObj_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                           in_stack_fffffffffffff9ec);
    local_80 = local_378;
    local_40 = local_80;
    local_28 = local_80;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    in_stack_fffffffffffff9fc = local_130;
    piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x16),local_128);
    *piVar4 = in_stack_fffffffffffff9fc;
  }
  local_3cc = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(local_138);
  uVar5 = extraout_RDX;
  while (local_3cc = local_3cc - 1, -1 < (int)local_3cc) {
    piVar4 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::index(local_138,(char *)(ulong)local_3cc,(int)uVar5);
    local_3d0 = *piVar4;
    if ((local_121 & 1) != 0) {
      local_b0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::value(local_138,local_3cc);
      local_a8 = local_470;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      in_stack_fffffffffffff9f8 = local_130;
      DataArray<int>::operator[](local_140,local_3d0);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c);
      local_88 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::value(local_138,local_3cc);
      local_90 = local_420;
      local_38 = local_90;
      local_30 = local_90;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    }
    local_a0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::value(local_138,local_3cc);
    local_98 = local_4c0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    in_stack_fffffffffffff9f4 = local_3d0;
    iVar2 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x4ff7e5);
    if (iVar2 <= in_stack_fffffffffffff9f4) {
      LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::LPColBase(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc);
      in_stack_fffffffffffff9f0 =
           nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x4ff805);
      for (local_5d4 = in_stack_fffffffffffff9f0; local_5d4 <= local_3d0; local_5d4 = local_5d4 + 1)
      {
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffffa00,
              (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      }
      LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x4ff86e);
    }
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add2((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8,
           (int *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    uVar5 = extraout_RDX_00;
  }
  (**(code **)(*in_RDI + 0x280))(in_RDI,1);
  iVar2 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x4ff8ce);
  (**(code **)(*in_RDI + 0x288))(in_RDI,iVar2 - local_12c);
  return;
}

Assistant:

void doAddRow(const LPRowBase<R>& row, bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(row);

      SVectorBase<R>& vec = rowVector_w(idx);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale && lp_scaler)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }